

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O3

objc_slot * objc_msg_lookup_sender(id *receiver,SEL selector,id sender)

{
  char cVar1;
  uint uVar2;
  uintptr_t addr;
  objc_slot *poVar3;
  id poVar4;
  
  poVar4 = *receiver;
  if (poVar4 != (id)0x0) {
    if (((ulong)poVar4 & 7) != 0) {
      poVar4 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)poVar4 & 7) << 3));
    }
    uVar2 = *poVar4->isa->dtable;
    poVar3 = (objc_slot *)
             (*(code *)(&DAT_00120b40 +
                       *(int *)(&DAT_00120b40 + (ulong)(uVar2 << 0x1d | uVar2 >> 3) * 4)))
                       (receiver,&DAT_00120b40,
                        &DAT_00120b40 +
                        *(int *)(&DAT_00120b40 + (ulong)(uVar2 << 0x1d | uVar2 >> 3) * 4),
                        (selector->field_0).name);
    return poVar3;
  }
  poVar3 = &nil_slot_v1;
  if (selector->types != (char *)0x0) {
    cVar1 = *selector->types;
    if (cVar1 == 'D') {
      poVar3 = &nil_slot_D_v1;
    }
    else if (cVar1 == 'f') {
      poVar3 = &nil_slot_f_v1;
    }
    else if (cVar1 == 'd') {
      poVar3 = &nil_slot_d_v1;
    }
  }
  return poVar3;
}

Assistant:

struct objc_slot *objc_msg_lookup_sender(id *receiver, SEL selector, id sender)
{
	// Returning a nil slot allows the caller to cache the lookup for nil too,
	// although this is not particularly useful because the nil method can be
	// inlined trivially.
	if (UNLIKELY(*receiver == nil))
	{
		// Return the correct kind of zero, depending on the type encoding.
		if (selector->types)
		{
			const char *t = selector->types;
			// Skip type qualifiers
			while ('r' == *t || 'n' == *t || 'N' == *t || 'o' == *t ||
			       'O' == *t || 'R' == *t || 'V' == *t || 'A' == *t)
			{
				t++;
			}
			switch (selector->types[0])
			{
				case 'D': return &nil_slot_D_v1;
				case 'd': return &nil_slot_d_v1;
				case 'f': return &nil_slot_f_v1;
			}
		}
		return &nil_slot_v1;
	}

	struct objc_slot2 *slot = objc_msg_lookup_internal(receiver, selector, NULL);
	uncacheable_slot_v1.owner = Nil;
	uncacheable_slot_v1.types = sel_getType_np(((struct objc_method*)slot)->selector);
	uncacheable_slot_v1.selector = selector;
	uncacheable_slot_v1.method = slot->method;
	return &uncacheable_slot_v1;
}